

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_status_t bpptree_insert(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  ion_bpp_external_address_t local_40;
  ion_file_offset_t offset;
  ion_err_t err;
  ion_dictionary_parent_t *piStack_30;
  ion_bpp_err_t bErr;
  ion_bpptree_t *bpptree;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_dictionary_t *dictionary_local;
  
  piStack_30 = dictionary->instance;
  local_40 = -1;
  bpptree = (ion_bpptree_t *)value;
  value_local = key;
  key_local = dictionary;
  offset._4_4_ = b_get(*(ion_bpp_handle_t *)(piStack_30 + 1),key,&local_40);
  if (offset._4_4_ == bErrKeyNotFound) {
    local_40 = -1;
  }
  offset._3_1_ = lfb_put((ion_lfb_t *)&piStack_30[1].record.value_size,(ion_byte_t *)bpptree,
                         (piStack_30->record).value_size,local_40,&local_40);
  if (offset._3_1_ == '\0') {
    if (offset._4_4_ == bErrKeyNotFound) {
      offset._4_4_ = b_insert(*(ion_bpp_handle_t *)(piStack_30 + 1),value_local,local_40);
    }
    else {
      offset._4_4_ = b_update(*(ion_bpp_handle_t *)(piStack_30 + 1),value_local,local_40);
    }
    if (offset._4_4_ == bErrOk) {
      dictionary_local._0_4_ = (uint)dictionary_local._1_3_ << 8;
      dictionary_local._4_4_ = 1;
    }
    else {
      dictionary_local._0_4_ = CONCAT31(dictionary_local._1_3_,0xc);
      dictionary_local._4_4_ = 0;
    }
  }
  else {
    dictionary_local._0_4_ = CONCAT31(dictionary_local._1_3_,0xc);
    dictionary_local._4_4_ = 0;
  }
  iVar1.count = dictionary_local._4_4_;
  iVar1._0_4_ = (int)dictionary_local;
  return iVar1;
}

Assistant:

ion_status_t
bpptree_insert(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_err_t			err;
	ion_file_offset_t	offset;

	bpptree = (ion_bpptree_t *) dictionary->instance;

	offset	= ION_FILE_NULL;
	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrKeyNotFound == bErr) {
		offset = ION_FILE_NULL;
	}

	err = lfb_put(&(bpptree->values), (ion_byte_t *) value, bpptree->super.record.value_size, offset, &offset);

	if (err_ok == err) {
		if (bErrKeyNotFound == bErr) {
			bErr = b_insert(bpptree->tree, key, offset);
		}
		else {
			bErr = b_update(bpptree->tree, key, offset);
		}

		if (bErrOk != bErr) {
			return ION_STATUS_ERROR(err_unable_to_insert);
		}

		return ION_STATUS_OK(1);
	}
	else {
		return ION_STATUS_ERROR(err_unable_to_insert);
	}
}